

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_result drwav_uninit(drwav *pWav)

{
  drwav_container dVar1;
  drwav_seek_proc p_Var2;
  drwav_bool32 dVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  drwav_result dVar8;
  void *pvVar9;
  drwav_uint64 paddingData;
  ulong local_20;
  
  if (pWav == (drwav *)0x0) {
    return -2;
  }
  dVar8 = 0;
  if (pWav->onWrite == (drwav_write_proc)0x0) goto LAB_00105457;
  uVar6 = 7;
  if ((pWav->container & ~drwav_container_rf64) == drwav_container_riff) {
    uVar6 = 1;
  }
  uVar6 = uVar6 & (uint)pWav->dataChunkDataSize;
  if (uVar6 != 0) {
    local_20 = 0;
    (*pWav->onWrite)(pWav->pUserData,&local_20,(size_t)uVar6);
  }
  p_Var2 = pWav->onSeek;
  if ((p_Var2 != (drwav_seek_proc)0x0) && (pWav->isSequentialWrite == 0)) {
    dVar1 = pWav->container;
    if (dVar1 == drwav_container_rf64) {
      dVar3 = (*p_Var2)(pWav->pUserData,0x14,drwav_seek_origin_start);
      if (dVar3 != 0) {
        uVar5 = pWav->dataChunkDataSize + (ulong)((uint)pWav->dataChunkDataSize & 1) + 0x40;
        local_20 = 0xffffffff;
        if (uVar5 < 0xffffffff) {
          local_20 = uVar5;
        }
        (*pWav->onWrite)(pWav->pUserData,&local_20,8);
      }
      dVar3 = (*pWav->onSeek)(pWav->pUserData,0x1c,drwav_seek_origin_start);
      if (dVar3 != 0) {
        local_20 = pWav->dataChunkDataSize;
LAB_00105420:
        pvVar9 = pWav->pUserData;
        sVar7 = 8;
LAB_00105431:
        (*pWav->onWrite)(pvVar9,&local_20,sVar7);
      }
    }
    else if (dVar1 == drwav_container_w64) {
      dVar3 = (*p_Var2)(pWav->pUserData,0x10,drwav_seek_origin_start);
      if (dVar3 != 0) {
        local_20 = pWav->dataChunkDataSize + (ulong)((uint)pWav->dataChunkDataSize & 7) + 0x68;
        (*pWav->onWrite)(pWav->pUserData,&local_20,8);
      }
      dVar3 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + 0x10,
                              drwav_seek_origin_start);
      if (dVar3 != 0) {
        local_20 = pWav->dataChunkDataSize + 0x18;
        goto LAB_00105420;
      }
    }
    else if (dVar1 == drwav_container_riff) {
      dVar3 = (*p_Var2)(pWav->pUserData,4,drwav_seek_origin_start);
      if (dVar3 != 0) {
        uVar4 = pWav->dataChunkDataSize + (ulong)((uint)pWav->dataChunkDataSize & 1) + 0x1c;
        uVar5 = 0xffffffff;
        if (uVar4 < 0xffffffff) {
          uVar5 = uVar4;
        }
        local_20 = CONCAT44(local_20._4_4_,(int)uVar5);
        (*pWav->onWrite)(pWav->pUserData,&local_20,4);
      }
      dVar3 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + 4,
                              drwav_seek_origin_start);
      if (dVar3 != 0) {
        local_20 = CONCAT44(local_20._4_4_,
                            -(uint)(pWav->dataChunkDataSize >> 0x20 != 0) |
                            (uint)pWav->dataChunkDataSize);
        pvVar9 = pWav->pUserData;
        sVar7 = 4;
        goto LAB_00105431;
      }
    }
  }
  dVar8 = 0;
  if ((pWav->isSequentialWrite != 0) &&
     (dVar8 = -10, pWav->dataChunkDataSize == pWav->dataChunkDataSizeTargetWrite)) {
    dVar8 = 0;
  }
LAB_00105457:
  if ((pWav->onRead == drwav__on_read_stdio) || (pWav->onWrite == drwav__on_write_stdio)) {
    fclose((FILE *)pWav->pUserData);
  }
  return dVar8;
}

Assistant:

DRWAV_API drwav_result drwav_uninit(drwav* pWav)
{
    drwav_result result = DRWAV_SUCCESS;

    if (pWav == NULL) {
        return DRWAV_INVALID_ARGS;
    }

    /*
    If the drwav object was opened in write mode we'll need to finalize a few things:
      - Make sure the "data" chunk is aligned to 16-bits for RIFF containers, or 64 bits for W64 containers.
      - Set the size of the "data" chunk.
    */
    if (pWav->onWrite != NULL) {
        drwav_uint32 paddingSize = 0;

        /* Padding. Do not adjust pWav->dataChunkDataSize - this should not include the padding. */
        if (pWav->container == drwav_container_riff || pWav->container == drwav_container_rf64) {
            paddingSize = drwav__chunk_padding_size_riff(pWav->dataChunkDataSize);
        } else {
            paddingSize = drwav__chunk_padding_size_w64(pWav->dataChunkDataSize);
        }
        
        if (paddingSize > 0) {
            drwav_uint64 paddingData = 0;
            drwav__write(pWav, &paddingData, paddingSize);  /* Byte order does not matter for this. */
        }

        /*
        Chunk sizes. When using sequential mode, these will have been filled in at initialization time. We only need
        to do this when using non-sequential mode.
        */
        if (pWav->onSeek && !pWav->isSequentialWrite) {
            if (pWav->container == drwav_container_riff) {
                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, 4, drwav_seek_origin_start)) {
                    drwav_uint32 riffChunkSize = drwav__riff_chunk_size_riff(pWav->dataChunkDataSize);
                    drwav__write_u32ne_to_le(pWav, riffChunkSize);
                }

                /* the "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos + 4, drwav_seek_origin_start)) {
                    drwav_uint32 dataChunkSize = drwav__data_chunk_size_riff(pWav->dataChunkDataSize);
                    drwav__write_u32ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == drwav_container_w64) {
                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, 16, drwav_seek_origin_start)) {
                    drwav_uint64 riffChunkSize = drwav__riff_chunk_size_w64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, riffChunkSize);
                }

                /* The "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos + 16, drwav_seek_origin_start)) {
                    drwav_uint64 dataChunkSize = drwav__data_chunk_size_w64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == drwav_container_rf64) {
                /* We only need to update the ds64 chunk. The "RIFF" and "data" chunks always have their sizes set to 0xFFFFFFFF for RF64. */
                int ds64BodyPos = 12 + 8;

                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 0, drwav_seek_origin_start)) {
                    drwav_uint64 riffChunkSize = drwav__riff_chunk_size_rf64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, riffChunkSize);
                }

                /* The "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 8, drwav_seek_origin_start)) {
                    drwav_uint64 dataChunkSize = drwav__data_chunk_size_rf64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            }
        }

        /* Validation for sequential mode. */
        if (pWav->isSequentialWrite) {
            if (pWav->dataChunkDataSize != pWav->dataChunkDataSizeTargetWrite) {
                result = DRWAV_INVALID_FILE;
            }
        }
    }

#ifndef DR_WAV_NO_STDIO
    /*
    If we opened the file with drwav_open_file() we will want to close the file handle. We can know whether or not drwav_open_file()
    was used by looking at the onRead and onSeek callbacks.
    */
    if (pWav->onRead == drwav__on_read_stdio || pWav->onWrite == drwav__on_write_stdio) {
        fclose((FILE*)pWav->pUserData);
    }
#endif

    return result;
}